

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

void __thiscall
sentencepiece::SentencePieceText::MergeFrom(SentencePieceText *this,SentencePieceText *from)

{
  InternalMetadata *this_00;
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  void **our_elems;
  void *pvVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    pvVar4 = this_00->ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pbVar6 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar6,*(ulong *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  iVar5 = (from->pieces_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar5 != 0) {
    pRVar3 = (from->pieces_).super_RepeatedPtrFieldBase.rep_;
    our_elems = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->pieces_).super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::TypeHandler>
              (&(this->pieces_).super_RepeatedPtrFieldBase,our_elems,pRVar3->elements,iVar5,
               ((this->pieces_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->pieces_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = iVar5 + (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
    (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar5;
    pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar5) {
      pRVar3->allocated_size = iVar5;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      pvVar2 = (from->text_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pvVar4 & 1) != 0) {
        pvVar4 = *(void **)((ulong)pvVar4 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set
                (&this->text_,(ulong)pvVar2 & 0xfffffffffffffffe,pvVar4);
    }
    if ((uVar1 & 2) != 0) {
      this->score_ = from->score_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void SentencePieceText::MergeFrom(const SentencePieceText& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.SentencePieceText)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  pieces_.MergeFrom(from.pieces_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_text(from._internal_text());
    }
    if (cached_has_bits & 0x00000002u) {
      score_ = from.score_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}